

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItem::scroll(QGraphicsItem *this,qreal dx,qreal dy,QRectF *rect)

{
  int iVar1;
  int iVar2;
  QGraphicsItemPrivate *this_00;
  KeyData *pKVar3;
  QRect QVar4;
  char cVar5;
  QGraphicsItemCache *pQVar6;
  QList<QRectF> *this_01;
  pointer pQVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  QRect *exposedRect;
  QRectF *pQVar10;
  long lVar11;
  long in_FS_OFFSET;
  ulong uVar12;
  double dVar13;
  QRegion exposed;
  undefined1 local_88 [16];
  double local_78;
  qreal qStack_70;
  undefined1 local_68 [12];
  Representation RStack_5c;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  QVar4._8_8_ = stack0xffffffffffffffa0;
  QVar4._0_8_ = local_68._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (((((dx != 0.0) || (NAN(dx))) || (dy != 0.0)) || (NAN(dy))) &&
     (_local_68 = QVar4, this_00->scene != (QGraphicsScene *)0x0)) {
    if (((((*(uint *)&this_00->field_0x160 & 0x600000) != 0x200000) ||
         (dVar13 = dx - (double)(int)dx, uVar12 = -(ulong)(dVar13 < -dVar13),
         1e-12 < (double)(~uVar12 & (ulong)dVar13 | (ulong)-dVar13 & uVar12))) ||
        ((dVar13 = dy - (double)(int)dy, uVar12 = -(ulong)(dVar13 < -dVar13),
         1e-12 < (double)(~uVar12 & (ulong)dVar13 | (ulong)-dVar13 & uVar12) ||
         (pQVar6 = QGraphicsItemPrivate::extraItemCache(this_00), pQVar6->allExposed != false)))) ||
       ((-1 < (pQVar6->fixedSize).wd.m_i && (-1 < (pQVar6->fixedSize).ht.m_i)))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        update(this,rect);
        return;
      }
      goto LAB_005edf8e;
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&local_58);
    cVar5 = QPixmapCache::find(&pQVar6->key,(QPixmap *)&local_58);
    if (cVar5 == '\0') {
      update(this,rect);
    }
    else {
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
      if ((((rect->w != 0.0) || (NAN(rect->w))) || (rect->h != 0.0)) || (NAN(rect->h))) {
        local_88._0_8_ = rect->xp;
        local_88._8_8_ = rect->yp;
        local_78 = rect->w;
        qStack_70 = rect->h;
      }
      else {
        (*this->_vptr_QGraphicsItem[3])(local_88,this);
      }
      _local_68 = (QRect)QRectF::toAlignedRect();
      cVar5 = QRect::intersects((QRect *)local_68);
      if (cVar5 != '\0') {
        QPixmapCache::remove(&pQVar6->key);
        exposed.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&exposed);
        iVar1 = (pQVar6->boundingRect).x1.m_i;
        iVar2 = (pQVar6->boundingRect).y1.m_i;
        local_88._0_8_ = CONCAT44(local_68._4_4_ - iVar2,local_68._0_4_ - iVar1);
        local_88._8_8_ = CONCAT44(RStack_5c.m_i - iVar2,local_68._8_4_ - iVar1);
        QPixmap::scroll((int)&local_58,(int)dx,(QRect *)(ulong)(uint)(int)dy,(QRegion *)local_88);
        QPixmapCache::insert((QPixmap *)local_88);
        pKVar3 = (pQVar6->key).d;
        (pQVar6->key).d = (KeyData *)local_88._0_8_;
        local_88._0_8_ = pKVar3;
        QPixmapCache::Key::~Key((Key *)local_88);
        this_01 = &pQVar6->exposed;
        if ((pQVar6->exposed).d.size != 0) {
          lVar11 = 0;
          uVar12 = 0;
          do {
            pQVar7 = QList<QRectF>::data(this_01);
            pQVar10 = (QRectF *)((long)&pQVar7->xp + lVar11);
            if (((rect->w != 0.0) || (NAN(rect->w))) || ((rect->h != 0.0 || (NAN(rect->h))))) {
              cVar5 = QRectF::intersects(pQVar10);
              if (cVar5 != '\0') goto LAB_005ede54;
            }
            else {
LAB_005ede54:
              pQVar10->xp = pQVar10->xp + dx;
              pQVar10->yp = pQVar10->yp + dy;
            }
            uVar12 = uVar12 + 1;
            lVar11 = lVar11 + 0x20;
          } while (uVar12 < (ulong)(pQVar6->exposed).d.size);
        }
        QRegion::translate((int)&exposed,(pQVar6->boundingRect).x1.m_i);
        puVar8 = (undefined8 *)QRegion::begin();
        puVar9 = (undefined8 *)QRegion::end();
        for (; puVar8 != puVar9; puVar8 = puVar8 + 2) {
          iVar1 = (int)*puVar8;
          iVar2 = (int)((ulong)*puVar8 >> 0x20);
          dVar13 = (double)iVar2;
          local_88._8_4_ = SUB84(dVar13,0);
          local_88._0_8_ = (double)iVar1;
          local_88._12_4_ = (int)((ulong)dVar13 >> 0x20);
          local_78 = (double)(((long)*(int *)(puVar8 + 1) - (long)iVar1) + 1);
          qStack_70 = (qreal)(((long)*(int *)((long)puVar8 + 0xc) - (long)iVar2) + 1);
          QtPrivate::QMovableArrayOps<QRectF>::emplace<QRectF>
                    ((QMovableArrayOps<QRectF> *)this_01,(pQVar6->exposed).d.size,(QRectF *)local_88
                    );
          QList<QRectF>::end(this_01);
        }
        QGraphicsScenePrivate::markDirty
                  (*(QGraphicsScenePrivate **)&this_00->scene->field_0x8,this,rect,false,false,false
                   ,false,false);
        QRegion::~QRegion(&exposed);
      }
    }
    QPixmap::~QPixmap((QPixmap *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005edf8e:
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::scroll(qreal dx, qreal dy, const QRectF &rect)
{
    Q_D(QGraphicsItem);
    if (dx == 0.0 && dy == 0.0)
        return;
    if (!d->scene)
        return;

    // Accelerated scrolling means moving pixels from one location to another
    // and only redraw the newly exposed area. The following requirements must
    // be fulfilled in order to do that:
    //
    // 1) Item is opaque.
    // 2) Item is not overlapped by other items.
    //
    // There's (yet) no way to detect whether an item is opaque or not, which means
    // we cannot do accelerated scrolling unless the cache is enabled. In case of using
    // DeviceCoordinate cache we also have to take the device transform into account in
    // order to determine whether we can do accelerated scrolling or not. That's left out
    // for simplicity here, but it is definitely something we can consider in the future
    // as a performance improvement.
    if (d->cacheMode != QGraphicsItem::ItemCoordinateCache
        || !qFuzzyIsNull(dx - int(dx)) || !qFuzzyIsNull(dy - int(dy))) {
        update(rect);
        return;
    }

    QGraphicsItemCache *cache = d->extraItemCache();
    if (cache->allExposed || cache->fixedSize.isValid()) {
        // Cache is either invalidated or item is scaled (see QGraphicsItem::setCacheMode).
        update(rect);
        return;
    }

    // Find pixmap in cache.
    QPixmap cachedPixmap;
    if (!QPixmapCache::find(cache->key, &cachedPixmap)) {
        update(rect);
        return;
    }

    QRect scrollRect = (rect.isNull() ? boundingRect() : rect).toAlignedRect();
    if (!scrollRect.intersects(cache->boundingRect))
        return; // Nothing to scroll.

    // Remove from cache to avoid deep copy when modifying.
    QPixmapCache::remove(cache->key);

    QRegion exposed;
    cachedPixmap.scroll(dx, dy, scrollRect.translated(-cache->boundingRect.topLeft()), &exposed);

    // Reinsert into cache.
    cache->key = QPixmapCache::insert(cachedPixmap);

    // Translate the existing expose.
    for (int i = 0; i < cache->exposed.size(); ++i) {
        QRectF &e = cache->exposed[i];
        if (!rect.isNull() && !e.intersects(rect))
            continue;
        e.translate(dx, dy);
    }

    // Append newly exposed areas. Note that the exposed region is currently
    // in pixmap coordinates, so we have to translate it to item coordinates.
    exposed.translate(cache->boundingRect.topLeft());
    for (const QRect &exposedRect : exposed)
        cache->exposed += exposedRect;

    // Trigger update. This will redraw the newly exposed area and make sure
    // the pixmap is re-blitted in case there are overlapping items.
    d->scene->d_func()->markDirty(this, rect);
}